

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O2

void Str_MuxChangeOnce(Str_Mux_t *pTree,int *pPath,int i,int k,Str_Mux_t *pBackup,Gia_Man_t *pNew,
                      Vec_Int_t *vDelay)

{
  Str_Edg_t *pSVar1;
  undefined4 *puVar2;
  uint *puVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  ulong uVar25;
  int *piVar26;
  Str_Mux_t *pSVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  uint local_64;
  
  iVar23 = i + 1;
  if (k <= iVar23) {
    __assert_fail("i + 1 < k",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStr.c"
                  ,0x609,
                  "void Str_MuxChangeOnce(Str_Mux_t *, int *, int, int, Str_Mux_t *, Gia_Man_t *, Vec_Int_t *)"
                 );
  }
  lVar31 = (long)k;
  if (pBackup != (Str_Mux_t *)0x0) {
    uVar19 = Abc_Lit2Var(pPath[lVar31]);
    pSVar27 = pTree + uVar19;
    iVar22 = pSVar27->Delay;
    iVar5 = pSVar27->Copy;
    iVar6 = pSVar27->nLutSize;
    pSVar1 = pTree[uVar19].Edge;
    iVar7 = pSVar1->Fan;
    iVar8 = pSVar1->fCompl;
    iVar9 = pSVar1->FanDel;
    iVar10 = pSVar1->Copy;
    pSVar1 = pTree[uVar19].Edge + 1;
    iVar11 = pSVar1->Fan;
    iVar12 = pSVar1->fCompl;
    iVar13 = pSVar1->FanDel;
    iVar14 = pSVar1->Copy;
    pSVar1 = pTree[uVar19].Edge + 2;
    iVar15 = pSVar1->Fan;
    iVar16 = pSVar1->fCompl;
    iVar17 = pSVar1->FanDel;
    iVar18 = pSVar1->Copy;
    pBackup->Id = pSVar27->Id;
    pBackup->Delay = iVar22;
    pBackup->Copy = iVar5;
    pBackup->nLutSize = iVar6;
    pBackup->Edge[0].Fan = iVar7;
    pBackup->Edge[0].fCompl = iVar8;
    pBackup->Edge[0].FanDel = iVar9;
    pBackup->Edge[0].Copy = iVar10;
    pBackup->Edge[1].Fan = iVar11;
    pBackup->Edge[1].fCompl = iVar12;
    pBackup->Edge[1].FanDel = iVar13;
    pBackup->Edge[1].Copy = iVar14;
    pBackup->Edge[2].Fan = iVar15;
    pBackup->Edge[2].fCompl = iVar16;
    pBackup->Edge[2].FanDel = iVar17;
    pBackup->Edge[2].Copy = iVar18;
    uVar19 = Abc_Lit2Var(pPath[iVar23]);
    pSVar27 = pTree + uVar19;
    iVar22 = pSVar27->Delay;
    iVar5 = pSVar27->Copy;
    iVar6 = pSVar27->nLutSize;
    pSVar1 = pTree[uVar19].Edge;
    iVar7 = pSVar1->Fan;
    iVar8 = pSVar1->fCompl;
    iVar9 = pSVar1->FanDel;
    iVar10 = pSVar1->Copy;
    pSVar1 = pTree[uVar19].Edge + 1;
    iVar11 = pSVar1->Fan;
    iVar12 = pSVar1->fCompl;
    iVar13 = pSVar1->FanDel;
    iVar14 = pSVar1->Copy;
    pSVar1 = pTree[uVar19].Edge + 2;
    iVar15 = pSVar1->Fan;
    iVar16 = pSVar1->fCompl;
    iVar17 = pSVar1->FanDel;
    iVar18 = pSVar1->Copy;
    pBackup[1].Id = pSVar27->Id;
    pBackup[1].Delay = iVar22;
    pBackup[1].Copy = iVar5;
    pBackup[1].nLutSize = iVar6;
    pBackup[1].Edge[0].Fan = iVar7;
    pBackup[1].Edge[0].fCompl = iVar8;
    pBackup[1].Edge[0].FanDel = iVar9;
    pBackup[1].Edge[0].Copy = iVar10;
    pBackup[1].Edge[1].Fan = iVar11;
    pBackup[1].Edge[1].fCompl = iVar12;
    pBackup[1].Edge[1].FanDel = iVar13;
    pBackup[1].Edge[1].Copy = iVar14;
    pBackup[1].Edge[2].Fan = iVar15;
    pBackup[1].Edge[2].fCompl = iVar16;
    pBackup[1].Edge[2].FanDel = iVar17;
    pBackup[1].Edge[2].Copy = iVar18;
    uVar19 = Abc_Lit2Var(pPath[i]);
    pSVar27 = pTree + uVar19;
    iVar22 = pSVar27->Delay;
    iVar5 = pSVar27->Copy;
    iVar6 = pSVar27->nLutSize;
    pSVar1 = pTree[uVar19].Edge;
    iVar7 = pSVar1->Fan;
    iVar8 = pSVar1->fCompl;
    iVar9 = pSVar1->FanDel;
    iVar10 = pSVar1->Copy;
    pSVar1 = pTree[uVar19].Edge + 1;
    iVar11 = pSVar1->Fan;
    iVar12 = pSVar1->fCompl;
    iVar13 = pSVar1->FanDel;
    iVar14 = pSVar1->Copy;
    pSVar1 = pTree[uVar19].Edge + 2;
    iVar15 = pSVar1->Fan;
    iVar16 = pSVar1->fCompl;
    iVar17 = pSVar1->FanDel;
    iVar18 = pSVar1->Copy;
    pBackup[2].Id = pSVar27->Id;
    pBackup[2].Delay = iVar22;
    pBackup[2].Copy = iVar5;
    pBackup[2].nLutSize = iVar6;
    pBackup[2].Edge[0].Fan = iVar7;
    pBackup[2].Edge[0].fCompl = iVar8;
    pBackup[2].Edge[0].FanDel = iVar9;
    pBackup[2].Edge[0].Copy = iVar10;
    pBackup[2].Edge[1].Fan = iVar11;
    pBackup[2].Edge[1].fCompl = iVar12;
    pBackup[2].Edge[1].FanDel = iVar13;
    pBackup[2].Edge[1].Copy = iVar14;
    pBackup[2].Edge[2].Fan = iVar15;
    pBackup[2].Edge[2].fCompl = iVar16;
    pBackup[2].Edge[2].FanDel = iVar17;
    pBackup[2].Edge[2].Copy = iVar18;
  }
  lVar28 = (long)i;
  uVar19 = Abc_Lit2Var(pPath[lVar31]);
  uVar20 = Abc_Lit2Var(pPath[iVar23]);
  uVar21 = Abc_Lit2Var(pPath[lVar28]);
  iVar22 = Abc_LitIsCompl(pPath[lVar31]);
  iVar23 = Abc_LitIsCompl(pPath[iVar23]);
  uVar24 = Abc_LitIsCompl(pPath[lVar28]);
  if (*(int *)((long)&pTree[uVar19].Edge[0].Fan + (ulong)(uint)(iVar22 << 4)) < 1) {
    __assert_fail("pSpots[0]->Edge[pInds[0]].Fan > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStr.c"
                  ,0x618,
                  "void Str_MuxChangeOnce(Str_Mux_t *, int *, int, int, Str_Mux_t *, Gia_Man_t *, Vec_Int_t *)"
                 );
  }
  if (*(int *)((long)&pTree[uVar20].Edge[0].Fan + (ulong)(uint)(iVar23 << 4)) < 1) {
    __assert_fail("pSpots[1]->Edge[pInds[1]].Fan > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStr.c"
                  ,0x619,
                  "void Str_MuxChangeOnce(Str_Mux_t *, int *, int, int, Str_Mux_t *, Gia_Man_t *, Vec_Int_t *)"
                 );
  }
  pSVar27 = pTree + uVar21;
  piVar26 = (int *)((long)&pTree[uVar19].Edge[0].Fan + (ulong)(uint)(iVar22 << 4));
  puVar2 = (undefined4 *)((long)&pTree[uVar20].Edge[0].Fan + (ulong)(uint)(iVar23 << 4));
  local_64 = 0;
  lVar30 = lVar28 + 1;
  for (lVar29 = lVar30; lVar29 < lVar31; lVar29 = lVar29 + 1) {
    uVar19 = Abc_Lit2Var(pPath[lVar29]);
    iVar23 = Abc_LitIsCompl(pPath[lVar29]);
    local_64 = local_64 ^
               *(uint *)((long)&pTree[uVar19].Edge[0].fCompl + (ulong)(uint)(iVar23 << 4));
  }
  uVar25 = (ulong)((uVar24 ^ 1) << 4);
  uVar4 = *(undefined4 *)((long)&pSVar27->Edge[0].Fan + uVar25);
  uVar19 = *(uint *)((long)&pSVar27->Edge[0].fCompl + uVar25);
  *(int *)((long)&pSVar27->Edge[0].Fan + uVar25) = *piVar26;
  *(undefined4 *)((long)&pSVar27->Edge[0].fCompl + uVar25) = 0;
  *piVar26 = pSVar27->Id;
  *puVar2 = uVar4;
  puVar2[1] = puVar2[1] ^ uVar19;
  *(undefined8 *)(puVar2 + 2) = *(undefined8 *)((long)&pSVar27->Edge[0].FanDel + uVar25);
  for (; lVar30 < lVar31; lVar30 = lVar30 + 1) {
    iVar23 = pSVar27->Edge[2].FanDel;
    uVar19 = Abc_Lit2Var(pPath[lVar30]);
    iVar23 = Str_Delay2(iVar23,pTree[uVar19].Edge[2].FanDel,pTree->nLutSize);
    pSVar27->Edge[2].FanDel = iVar23;
  }
  if (pNew != (Gia_Man_t *)0x0) {
    iVar23 = 1;
    for (lVar30 = lVar28; lVar30 < lVar31; lVar30 = lVar30 + 1) {
      uVar19 = Abc_Lit2Var(pPath[lVar30]);
      if (pTree[uVar19].Edge[2].fCompl != 0) {
        __assert_fail("pTree[Abc_Lit2Var(pPath[c])].Edge[2].fCompl == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStr.c"
                      ,0x636,
                      "void Str_MuxChangeOnce(Str_Mux_t *, int *, int, int, Str_Mux_t *, Gia_Man_t *, Vec_Int_t *)"
                     );
      }
      uVar19 = Abc_Lit2Var(pPath[lVar30]);
      iVar22 = pTree[uVar19].Edge[2].Copy;
      uVar19 = Abc_LitIsCompl(pPath[lVar30]);
      iVar22 = Abc_LitNotCond(iVar22,uVar19 ^ 1);
      iVar23 = Gia_ManHashAnd(pNew,iVar23,iVar22);
      iVar22 = Abc_Lit2Var(iVar23);
      Str_ObjDelay(pNew,iVar22,pTree->nLutSize,vDelay);
    }
    uVar19 = Abc_LitIsCompl(pPath[lVar28]);
    iVar23 = Abc_LitNotCond(iVar23,uVar19 ^ 1);
    pSVar27->Edge[2].Copy = iVar23;
    puVar3 = (uint *)((long)&pSVar27->Edge[0].fCompl + (ulong)(uVar24 << 4));
    *puVar3 = *puVar3 ^ local_64;
  }
  return;
}

Assistant:

void Str_MuxChangeOnce( Str_Mux_t * pTree, int * pPath, int i, int k, Str_Mux_t * pBackup, Gia_Man_t * pNew, Vec_Int_t * vDelay )
{
    Str_Mux_t * pSpots[3];
    int pInds[3], MidFan, MidCom, MidDel, MidCop, c;
    int iRes, iCond, fCompl;
    // save backup
    assert( i + 1 < k );
    if ( pBackup )
    {
        pBackup[0] = pTree[ Abc_Lit2Var(pPath[k])  ];
        pBackup[1] = pTree[ Abc_Lit2Var(pPath[i+1])];
        pBackup[2] = pTree[ Abc_Lit2Var(pPath[i])  ];
    }
    // perform changes
    pSpots[0] = pTree + Abc_Lit2Var(pPath[k]); 
    pSpots[1] = pTree + Abc_Lit2Var(pPath[i+1]); 
    pSpots[2] = pTree + Abc_Lit2Var(pPath[i]); 
    pInds[0] = Abc_LitIsCompl(pPath[k]);
    pInds[1] = Abc_LitIsCompl(pPath[i+1]);
    pInds[2] = Abc_LitIsCompl(pPath[i]);
    // check
    assert( pSpots[0]->Edge[pInds[0]].Fan > 0 );
    assert( pSpots[1]->Edge[pInds[1]].Fan > 0 );
    // collect complement
    fCompl = 0;
    for ( c = i+1; c < k; c++ )
        fCompl ^= pTree[Abc_Lit2Var(pPath[c])].Edge[Abc_LitIsCompl(pPath[c])].fCompl;
    // remember bottom side
    MidFan = pSpots[2]->Edge[!pInds[2]].Fan;
    MidCom = pSpots[2]->Edge[!pInds[2]].fCompl;
    MidDel = pSpots[2]->Edge[!pInds[2]].FanDel;
    MidCop = pSpots[2]->Edge[!pInds[2]].Copy;
    // update bottom
    pSpots[2]->Edge[!pInds[2]].Fan    = pSpots[0]->Edge[pInds[0]].Fan;
    pSpots[2]->Edge[!pInds[2]].fCompl = 0;
    // update top 
    pSpots[0]->Edge[pInds[0]].Fan     = pSpots[2]->Id;
    // update middle
    pSpots[1]->Edge[pInds[1]].Fan     = MidFan;
    pSpots[1]->Edge[pInds[1]].fCompl ^= MidCom;
    pSpots[1]->Edge[pInds[1]].FanDel  = MidDel;
    pSpots[1]->Edge[pInds[1]].Copy    = MidCop;
    // update delay of the control
    for ( c = i + 1; c < k; c++ )
        pSpots[2]->Edge[2].FanDel = Str_Delay2( pSpots[2]->Edge[2].FanDel, pTree[Abc_Lit2Var(pPath[c])].Edge[2].FanDel, pTree->nLutSize );
    if ( pNew == NULL )
        return;
    // create AND gates
    iRes = 1;
    for ( c = i; c < k; c++ )
    {
        assert( pTree[Abc_Lit2Var(pPath[c])].Edge[2].fCompl == 0 );
        iCond = pTree[Abc_Lit2Var(pPath[c])].Edge[2].Copy;
        iCond = Abc_LitNotCond( iCond, !Abc_LitIsCompl(pPath[c]) );
        iRes  = Gia_ManHashAnd( pNew, iRes, iCond );
        Str_ObjDelay( pNew, Abc_Lit2Var(iRes), pTree->nLutSize, vDelay );
    }
    // complement the condition
    pSpots[2]->Edge[2].Copy = Abc_LitNotCond( iRes, !Abc_LitIsCompl(pPath[i]) );
    // complement the path
    pSpots[2]->Edge[pInds[2]].fCompl ^= fCompl;
}